

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O3

bool DiffTemplates(char *filename_a,char *filename_b,Strip strip)

{
  pointer pVVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  string *psVar6;
  pointer __s1;
  pointer pcVar7;
  ulong uVar8;
  string *psVar9;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_b;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_a;
  uint local_b0;
  uint local_ac;
  VariableAndMods local_a8;
  VariableAndMods local_88;
  string local_70;
  string local_50;
  
  local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = LoadVariables(filename_a,strip,&local_88);
  if ((bVar3) && (bVar3 = LoadVariables(filename_b,strip,&local_a8), bVar3)) {
    lVar5 = (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 6;
    if (lVar5 != (long)local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) {
      LogPrintf(4,"Templates differ: %s [%d vars] vs. %s [%d vars].\n",filename_a,lVar5,filename_b);
    }
    local_b0 = 0;
    if ((local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
         super__Vector_impl_data._M_start ==
         local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar8 = 0;
    }
    else {
      psVar6 = &(local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                 _M_impl.super__Vector_impl_data._M_start)->modifiers;
      psVar9 = &(local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                 _M_impl.super__Vector_impl_data._M_start)->modifiers;
      local_ac = 0;
      local_b0 = 0;
      do {
        sVar2 = (((VariableAndMod *)(psVar6 + -1))->variable_name)._M_string_length;
        if (sVar2 == (((VariableAndMod *)(psVar9 + -1))->variable_name)._M_string_length) {
          if (sVar2 != 0) {
            pcVar7 = (((VariableAndMod *)(psVar9 + -1))->variable_name)._M_dataplus._M_p;
            __s1 = (((VariableAndMod *)(psVar6 + -1))->variable_name)._M_dataplus._M_p;
            iVar4 = bcmp(__s1,pcVar7,sVar2);
            if (iVar4 != 0) goto LAB_00102a43;
          }
        }
        else {
          __s1 = (((VariableAndMod *)(psVar6 + -1))->variable_name)._M_dataplus._M_p;
          pcVar7 = (((VariableAndMod *)(psVar9 + -1))->variable_name)._M_dataplus._M_p;
LAB_00102a43:
          LogPrintf(4,"Variable name mismatch: %s vs. %s\n",__s1,pcVar7);
        }
        iVar4 = std::__cxx11::string::compare((char *)psVar6);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)psVar9), iVar4 == 0)) {
          local_ac = local_ac + 1;
        }
        else {
          sVar2 = psVar6->_M_string_length;
          if (sVar2 == psVar9->_M_string_length) {
            if (sVar2 != 0) {
              pcVar7 = (psVar6->_M_dataplus)._M_p;
              iVar4 = bcmp(pcVar7,(psVar9->_M_dataplus)._M_p,sVar2);
              if (iVar4 != 0) goto LAB_00102ab6;
            }
          }
          else {
            pcVar7 = (psVar6->_M_dataplus)._M_p;
LAB_00102ab6:
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar7,pcVar7 + sVar2);
            pcVar7 = (psVar9->_M_dataplus)._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar7,pcVar7 + psVar9->_M_string_length);
            bVar3 = SuppressLameDiff(&local_70,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (!bVar3) {
              local_b0 = local_b0 + 1;
              LogPrintf(1,"Difference for variable %s -- %s vs. %s\n",
                        (((VariableAndMod *)(psVar6 + -1))->variable_name)._M_dataplus._M_p,
                        (psVar6->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p);
            }
          }
        }
        if ((pointer)(psVar6 + 1) ==
            local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pVVar1 = (pointer)(psVar9 + 1);
        psVar6 = psVar6 + 2;
        psVar9 = psVar9 + 2;
      } while (pVVar1 != local_a8.
                         super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl
                         .super__Vector_impl_data._M_finish);
      uVar8 = (ulong)local_ac;
    }
    LogPrintf(0,"Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
              (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 6,(ulong)local_b0,uVar8);
    bVar3 = local_b0 == 0;
  }
  else {
    bVar3 = false;
  }
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector(&local_a8);
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector(&local_88);
  return bVar3;
}

Assistant:

bool DiffTemplates(const char* filename_a, const char* filename_b,
                   Strip strip) {
  vector<VariableAndMod> vars_and_mods_a, vars_and_mods_b;

  if (!LoadVariables(filename_a, strip, vars_and_mods_a) ||
      !LoadVariables(filename_b, strip, vars_and_mods_b))
    return false;

  if (vars_and_mods_a.size() != vars_and_mods_b.size())
    LogPrintf(LOG_FATAL, "Templates differ: %s [%d vars] vs. %s [%d vars].\n",
              filename_a, vars_and_mods_a.size(),
              filename_b, vars_and_mods_b.size());

  int mismatch_count = 0;      // How many differences there were.
  int no_modifiers_count = 0;  // How many variables without modifiers.
  VariableAndMods::const_iterator iter_a, iter_b;
  for (iter_a = vars_and_mods_a.begin(), iter_b = vars_and_mods_b.begin();
       iter_a != vars_and_mods_a.end() && iter_b != vars_and_mods_b.end();
       ++iter_a, ++iter_b) {
    // The templates have different variables, we fail!
    if (iter_a->variable_name != iter_b->variable_name)
      LogPrintf(LOG_FATAL, "Variable name mismatch: %s vs. %s\n",
                iter_a->variable_name.c_str(),
                iter_b->variable_name.c_str());
    // Variables without modifiers are ignored from the diff. They simply
    // get counted and the count is shown in verbose logging/
    if (iter_a->modifiers == "" || iter_b->modifiers == "") {
      no_modifiers_count++;
    } else {
      if (iter_a->modifiers != iter_b->modifiers &&
          !SuppressLameDiff(iter_a->modifiers, iter_b->modifiers)) {
        mismatch_count++;
        LogPrintf(LOG_INFO, "Difference for variable %s -- %s vs. %s\n",
                  iter_a->variable_name.c_str(),
                  iter_a->modifiers.c_str(), iter_b->modifiers.c_str());
      }
    }
  }

  LogPrintf(LOG_VERBOSE, "Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
            vars_and_mods_a.size(), mismatch_count, no_modifiers_count);

  return (mismatch_count == 0);
}